

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O1

void __thiscall xray_re::_lzhuf::DeleteNode(_lzhuf *this,int p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  if (this->dad[p] != 0x1000) {
    piVar1 = this->rson;
    iVar2 = this->lson[p];
    iVar3 = iVar2;
    if ((this->rson[p] != 0x1000) && (iVar3 = this->rson[p], iVar2 != 0x1000)) {
      iVar3 = iVar2;
      if (piVar1[iVar2] != 0x1000) {
        do {
          iVar2 = piVar1[iVar2];
        } while (piVar1[iVar2] != 0x1000);
        this->rson[this->dad[iVar2]] = this->lson[iVar2];
        this->dad[this->lson[iVar2]] = this->dad[iVar2];
        this->lson[iVar2] = this->lson[p];
        this->dad[this->lson[p]] = iVar2;
        iVar3 = iVar2;
      }
      this->rson[iVar3] = this->rson[p];
      this->dad[this->rson[p]] = iVar3;
    }
    this->dad[iVar3] = this->dad[p];
    piVar4 = this->lson;
    if (this->rson[this->dad[p]] == p) {
      piVar4 = piVar1;
    }
    piVar4[this->dad[p]] = iVar3;
    this->dad[p] = 0x1000;
  }
  return;
}

Assistant:

void _lzhuf::DeleteNode(int p)  /* remove from tree */
{
	int  q;

	if (dad[p] == NIL)
		return;			/* not registered */
	if (rson[p] == NIL)
		q = lson[p];
	else
	if (lson[p] == NIL)
		q = rson[p];
	else {
		q = lson[p];
		if (rson[q] != NIL) {
			do {
				q = rson[q];
			} while (rson[q] != NIL);
			rson[dad[q]] = lson[q];
			dad[lson[q]] = dad[q];
			lson[q] = lson[p];
			dad[lson[p]] = q;
		}
		rson[q] = rson[p];
		dad[rson[p]] = q;
	}
	dad[q] = dad[p];
	if (rson[dad[p]] == p)
		rson[dad[p]] = q;
	else
		lson[dad[p]] = q;
	dad[p] = NIL;
}